

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::CompiledType::getSchema
          (Maybe<capnp::Type> *__return_storage_ptr__,CompiledType *this)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *pMVar1;
  Compiler *pCVar2;
  Builder target;
  Reader proto;
  ArrayPtr<capnp::word> firstSegment;
  Type TVar3;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  Builder builder;
  MallocMessageBuilder message;
  word scratch [32];
  Builder local_2a8;
  StructBuilder local_290;
  PointerBuilder local_268;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  MallocMessageBuilder local_218;
  word local_128 [33];
  
  memset(local_128,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = local_128;
  MallocMessageBuilder::MallocMessageBuilder(&local_218,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_2a8,&local_218.super_MessageBuilder);
  local_268.pointer = local_2a8.builder.pointer;
  local_268.segment = local_2a8.builder.segment;
  local_268.capTable = local_2a8.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_290,&local_268,(StructSize)0x10003,(word *)0x0);
  pCVar2 = this->compiler;
  pMVar1 = &pCVar2->impl;
  local_268.segment = (SegmentBuilder *)((ulong)local_268.segment & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar1->mutex,1);
  local_2a8.builder.capTable = (CapTableBuilder *)&(pCVar2->impl).value;
  target._builder.capTable = local_290.capTable;
  target._builder.segment = local_290.segment;
  target._builder.data = local_290.data;
  target._builder.pointers = local_290.pointers;
  target._builder.dataSize = local_290.dataSize;
  target._builder.pointerCount = local_290.pointerCount;
  target._builder._38_2_ = local_290._38_2_;
  local_2a8.builder.segment = (SegmentBuilder *)pMVar1;
  BrandedDecl::compileAsType(&(this->decl).value,(ErrorReporter *)&ErrorIgnorer::instance,target);
  if (local_2a8.builder.segment != (SegmentBuilder *)0x0) {
    kj::_::Mutex::unlock((Mutex *)local_2a8.builder.segment,SHARED,(Waiter *)0x0);
  }
  pCVar2 = this->compiler;
  capnp::_::StructBuilder::asReader(&local_290);
  proto._reader.capTable = (CapTableReader *)uStack_240;
  proto._reader.segment = (SegmentReader *)local_248;
  proto._reader.data = (void *)local_238;
  proto._reader.pointers = (WirePointer *)uStack_230;
  proto._reader.dataSize = (undefined4)local_228;
  proto._reader.pointerCount = local_228._4_2_;
  proto._reader._38_2_ = local_228._6_2_;
  proto._reader._40_8_ = uStack_220;
  TVar3 = SchemaLoader::getType(&pCVar2->loader,proto,(Schema)0x28e630);
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value = TVar3;
  MallocMessageBuilder::~MallocMessageBuilder(&local_218);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::CompiledType::getSchema() {
  capnp::word scratch[32];
  memset(&scratch, 0, sizeof(scratch));
  capnp::MallocMessageBuilder message(scratch);
  auto builder = message.getRoot<schema::Type>();

  {
    auto lock = compiler.impl.lockShared();
    decl.get(lock).compileAsType(ErrorIgnorer::instance, builder);
  }

  // No need to pass `scope` as second parameter since CompiledType always represents a type
  // expression evaluated free-standing, not in any scope.
  return compiler.loader.getType(builder.asReader());
}